

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
           *this,InstanceBodySymbol **p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  locator lStack_18;
  
  *num_destroyed = *num_destroyed + 1;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
  ::nosize_unchecked_emplace_at<slang::ast::InstanceBodySymbol_const*>
            (&lStack_18,
             (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,p);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }